

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O3

void TestAppenderError(duckdb_appender *appender,string *expected)

{
  undefined1 uVar1;
  char *pcVar2;
  char *error;
  AssertionHandler catchAssertionHandler;
  undefined8 local_e8;
  char *local_e0;
  SourceLineInfo local_d8;
  ITransientExpression local_c8;
  char **local_b8;
  char *local_b0;
  size_t sStack_a8;
  undefined8 *local_a0;
  AssertionHandler local_98;
  StringRef local_50;
  StringRef local_40;
  
  pcVar2 = (char *)duckdb_appender_error(*appender);
  local_c8._vptr_ITransientExpression = (_func_int **)0x4aafe1;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_d8.line = 0x23;
  local_e0 = pcVar2;
  Catch::StringRef::StringRef(&local_40,"error != nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&local_98,(StringRef *)&local_c8,&local_d8,local_40,Normal);
  local_e8 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_d8,"!=");
  local_c8.m_result = pcVar2 != (char *)0x0;
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005c8418;
  local_b0 = local_d8.file;
  sStack_a8 = local_d8.line;
  local_b8 = &local_e0;
  local_a0 = &local_e8;
  Catch::AssertionHandler::handleExpr(&local_98,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_c8._vptr_ITransientExpression = (_func_int **)0x4aafe1;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_d8.line = 0x24;
  Catch::StringRef::StringRef(&local_50,"duckdb::StringUtil::Contains(error, expected)");
  Catch::AssertionHandler::AssertionHandler
            (&local_98,(StringRef *)&local_c8,&local_d8,local_50,Normal);
  std::__cxx11::string::string((string *)&local_c8,local_e0,(allocator *)&local_e8);
  uVar1 = duckdb::StringUtil::Contains((string *)&local_c8,(string *)expected);
  local_d8.file = (char *)CONCAT71(local_d8.file._1_7_,uVar1);
  Catch::AssertionHandler::handleExpr<bool>(&local_98,(ExprLhs<bool> *)&local_d8);
  if ((char ***)local_c8._vptr_ITransientExpression != &local_b8) {
    operator_delete(local_c8._vptr_ITransientExpression);
  }
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  return;
}

Assistant:

void TestAppenderError(duckdb_appender &appender, const string &expected) {
	auto error = duckdb_appender_error(appender);
	REQUIRE(error != nullptr);
	REQUIRE(duckdb::StringUtil::Contains(error, expected));
}